

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDUtils.cpp
# Opt level: O0

string * GetRegisterName_abi_cxx11_(SWDRegisters reg)

{
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  SWDRegisters reg_local;
  
  this = (string *)CONCAT44(in_register_0000003c,reg);
  psStack_10 = this;
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"IDCODE",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ABORT",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"CTRL/STAT",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"WCR",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"RESEND",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"SELECT",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"RDBUFF",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ROUTESEL",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"CSW",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"TAR",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"DRW",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"BD0",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"BD1",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"BD2",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"BD3",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"CFG",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"BASE",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"RAZ_WI",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"IDR",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"??",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  return this;
}

Assistant:

std::string GetRegisterName( SWDRegisters reg )
{
    switch( reg )
    {
    case SWDR_DP_IDCODE:
        return "IDCODE";
    case SWDR_DP_ABORT:
        return "ABORT";
    case SWDR_DP_CTRL_STAT:
        return "CTRL/STAT";
    case SWDR_DP_WCR:
        return "WCR";
    case SWDR_DP_RESEND:
        return "RESEND";
    case SWDR_DP_SELECT:
        return "SELECT";
    case SWDR_DP_RDBUFF:
        return "RDBUFF";
    case SWDR_DP_ROUTESEL:
        return "ROUTESEL";

    case SWDR_AP_CSW:
        return "CSW";
    case SWDR_AP_TAR:
        return "TAR";
    case SWDR_AP_DRW:
        return "DRW";
    case SWDR_AP_BD0:
        return "BD0";
    case SWDR_AP_BD1:
        return "BD1";
    case SWDR_AP_BD2:
        return "BD2";
    case SWDR_AP_BD3:
        return "BD3";
    case SWDR_AP_CFG:
        return "CFG";
    case SWDR_AP_BASE:
        return "BASE";
    case SWDR_AP_RAZ_WI:
        return "RAZ_WI";
    case SWDR_AP_IDR:
        return "IDR";
    }

    return "??";
}